

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsSetup(CVodeMem cv_mem,int convfail,N_Vector ypred,N_Vector fpred,int *jcurPtr,
             N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  void *pvVar1;
  SUNLinearSolver_Type SVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  int *in_R8;
  SUNMatrix in_R9;
  SUNLinearSolver in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  realtype dgamma;
  CVLsMem cvls_mem;
  SUNMatrix in_stack_ffffffffffffff88;
  SUNLinearSolver in_stack_ffffffffffffff90;
  bool local_55;
  int local_c;
  
  if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,"CVLS","cvLsSetup","Linear solver memory is NULL.");
    local_c = -2;
  }
  else {
    pvVar1 = in_RDI->cv_lmem;
    SVar2 = SUNLinSolGetType((SUNLinearSolver)0x11993d3);
    if (SVar2 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
      *(undefined4 *)((long)pvVar1 + 0x130) = 0;
      local_c = *(int *)((long)pvVar1 + 0x130);
    }
    else {
      *(undefined8 *)((long)pvVar1 + 0x70) = in_RDX;
      *(undefined8 *)((long)pvVar1 + 0x78) = in_RCX;
      local_55 = true;
      if (((in_RDI->cv_nst != 0) &&
          (local_55 = true,
          in_RDI->cv_nst < *(long *)((long)pvVar1 + 0x98) + *(long *)((long)pvVar1 + 0x80))) &&
         ((in_ESI != 1 ||
          (local_55 = true,
          *(double *)((long)pvVar1 + 0x28) <= ABS(in_RDI->cv_gamma / in_RDI->cv_gammap - 1.0))))) {
        local_55 = in_ESI == 2;
      }
      *(uint *)((long)pvVar1 + 0x20) = (uint)local_55;
      if (*(long *)((long)pvVar1 + 0x50) == 0) {
        *in_R8 = *(int *)((long)pvVar1 + 0x20);
        in_R9 = in_stack_ffffffffffffff88;
      }
      else {
        iVar3 = (**(code **)((long)pvVar1 + 0x120))
                          (in_RDI->cv_tn,SUB84(in_RDI->cv_gamma,0),in_RDX,in_RCX,
                           *(undefined8 *)((long)pvVar1 + 0x50),
                           (*(int *)((long)pvVar1 + 0x20) != 0 ^ 0xffU) & 1,in_R8,
                           *(undefined8 *)((long)pvVar1 + 0x128),in_R9,in_stack_00000008,
                           in_stack_00000010);
        if (*in_R8 != 0) {
          *(long *)((long)pvVar1 + 0x88) = *(long *)((long)pvVar1 + 0x88) + 1;
          *(long *)((long)pvVar1 + 0x98) = in_RDI->cv_nst;
        }
        in_stack_ffffffffffffff90 = in_stack_00000008;
        if (iVar3 != 0) {
          if (*(int *)((long)pvVar1 + 0x118) == 0) {
            return iVar3;
          }
          if (iVar3 < 0) {
            cvProcessError(in_RDI,-6,"CVLS","cvLsSetup",
                           "The Jacobian routine failed in an unrecoverable manner.");
            *(undefined4 *)((long)pvVar1 + 0x130) = 0xfffffffa;
            return -1;
          }
          *(undefined4 *)((long)pvVar1 + 0x130) = 0xfffffff9;
          return 1;
        }
      }
      iVar3 = SUNLinSolSetup(in_stack_ffffffffffffff90,in_R9);
      *(int *)((long)pvVar1 + 0x130) = iVar3;
      if (*(long *)((long)pvVar1 + 0x50) == 0) {
        if (*in_R8 != 0) {
          *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 1;
          *(long *)((long)pvVar1 + 0x98) = in_RDI->cv_nst;
        }
        if (*(int *)((long)pvVar1 + 0x20) != 0) {
          *in_R8 = 1;
        }
      }
      local_c = *(int *)((long)pvVar1 + 0x130);
    }
  }
  return local_c;
}

Assistant:

int cvLsSetup(CVodeMem cv_mem, int convfail, N_Vector ypred,
              N_Vector fpred, booleantype *jcurPtr,
              N_Vector vtemp1, N_Vector vtemp2, N_Vector vtemp3)
{
  CVLsMem  cvls_mem;
  realtype dgamma;
  int      retval;

  /* access CVLsMem structure */
  if (cv_mem->cv_lmem==NULL) {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, "CVLS",
                   "cvLsSetup", MSG_LS_LMEM_NULL);
    return(CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(cvls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    cvls_mem->last_flag = CVLS_SUCCESS;
    return(cvls_mem->last_flag);
  }

  /* Set CVLs N_Vector pointers to current solution and rhs */
  cvls_mem->ycur = ypred;
  cvls_mem->fcur = fpred;

  /* Use nst, gamma/gammap, and convfail to set J/P eval. flag jok */
  dgamma = SUNRabs((cv_mem->cv_gamma/cv_mem->cv_gammap) - ONE);
  cvls_mem->jbad = (cv_mem->cv_nst == 0) ||
    (cv_mem->cv_nst >= cvls_mem->nstlj + cvls_mem->msbj) ||
    ((convfail == CV_FAIL_BAD_J) && (dgamma < cvls_mem->dgmax_jbad)) ||
    (convfail == CV_FAIL_OTHER);

  /* Setup the linear system if necessary */
  if (cvls_mem->A != NULL) {

    /* Update J if appropriate and evaluate A = I - gamma J */
    retval = cvls_mem->linsys(cv_mem->cv_tn, ypred, fpred, cvls_mem->A,
                              !(cvls_mem->jbad), jcurPtr, cv_mem->cv_gamma,
                              cvls_mem->A_data, vtemp1, vtemp2, vtemp3);

    /* Update J eval count and step when J was last updated */
    if (*jcurPtr) {
      cvls_mem->nje++;
      cvls_mem->nstlj = cv_mem->cv_nst;
    }

    /* Check linsys() return value and return if necessary */
    if (retval != CVLS_SUCCESS) {
      if (cvls_mem->user_linsys) {
        if (retval < 0) {
          cvProcessError(cv_mem, CVLS_JACFUNC_UNRECVR, "CVLS",
                         "cvLsSetup",  MSG_LS_JACFUNC_FAILED);
          cvls_mem->last_flag = CVLS_JACFUNC_UNRECVR;
          return(-1);
        } else {
          cvls_mem->last_flag = CVLS_JACFUNC_RECVR;
          return(1);
        }
      } else {
        return(retval);
      }
    }

  } else {

    /* Matrix-free case, set jcur to jbad */
    *jcurPtr = cvls_mem->jbad;

  }

  /* Call LS setup routine -- the LS may call cvLsPSetup, who will
     pass the heuristic suggestions above to the user code(s) */
  cvls_mem->last_flag = SUNLinSolSetup(cvls_mem->LS, cvls_mem->A);

  /* If Matrix-free, update heuristics flags */
  if (cvls_mem->A == NULL) {

    /* If user set jcur to SUNTRUE, increment npe and save nst value */
    if (*jcurPtr) {
      cvls_mem->npe++;
      cvls_mem->nstlj = cv_mem->cv_nst;
    }

    /* Update jcur flag if we suggested an update */
    if (cvls_mem->jbad) *jcurPtr = SUNTRUE;
  }

  return(cvls_mem->last_flag);
}